

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::IsnanCase::getInputValues(IsnanCase *this,int numValues,void **values)

{
  Precision PVar1;
  pointer pSVar2;
  deUint32 dVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  Random rnd;
  deRandom local_40;
  
  dVar3 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar3 ^ 0xc2a39f);
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  iVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  uVar7 = (0x3fffffU >> (0x17 - (&DAT_01c14308)[(ulong)PVar1 * 4] & 0x1f)) <<
          (0x17 - (&DAT_01c14308)[(ulong)PVar1 * 4] & 0x1f);
  if (0 < iVar4 * numValues) {
    uVar5 = 0;
    do {
      fVar9 = deRandom_getFloat(&local_40);
      if (fVar9 <= 0.3) {
        fVar9 = deRandom_getFloat(&local_40);
        if (fVar9 <= 0.4) {
          dVar3 = deRandom_getUint32(&local_40);
          uVar6 = dVar3 & uVar7 | 0x400000;
          dVar3 = deRandom_getUint32(&local_40);
          uVar8 = (dVar3 & 0x7f) << 0x17;
        }
        else {
          uVar8 = 0x7f800000;
          uVar6 = 0;
        }
      }
      else {
        dVar3 = deRandom_getUint32(&local_40);
        uVar6 = dVar3 & uVar7 | 0x400000;
        uVar8 = 0x7f800000;
      }
      dVar3 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)*values + uVar5 * 4) = dVar3 << 0x1f | uVar8 | uVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)(iVar4 * numValues) != uVar5);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(getName()) ^ 0xc2a39fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			mantissaMask	= ~getMaxUlpDiffFromBits(mantissaBits) & ((1u<<23)-1u);

		for (int valNdx = 0; valNdx < numValues*scalarSize; valNdx++)
		{
			const bool		isNan		= rnd.getFloat() > 0.3f;
			const bool		isInf		= !isNan && rnd.getFloat() > 0.4f;
			const deUint32	mantissa	= !isInf ? ((1u<<22) | (rnd.getUint32() & mantissaMask)) : 0;
			const deUint32	exp			= !isNan && !isInf ? (rnd.getUint32() & 0x7fu) : 0xffu;
			const deUint32	sign		= rnd.getUint32() & 0x1u;
			const deUint32	value		= (sign << 31) | (exp << 23) | mantissa;

			DE_ASSERT(tcu::Float32(value).isInf() == isInf && tcu::Float32(value).isNaN() == isNan);

			((deUint32*)values[0])[valNdx] = value;
		}
	}